

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_cmn_set_linger(int sock)

{
  uint __errnum;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDI;
  int ret;
  linger linger_opt;
  undefined4 local_10;
  undefined4 local_c;
  uint local_4;
  
  local_10 = 1;
  local_c = 0;
  iVar1 = setsockopt(in_EDI,1,0xd,&local_10,8);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_ERROR,"setsockopt(SO_LINGER): %d (%s)",(ulong)__errnum,pcVar3);
    local_4 = __errnum;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int isobusfs_cmn_set_linger(int sock)
{
	struct linger linger_opt;
	int ret;

	linger_opt.l_onoff = 1;
	linger_opt.l_linger = 0;
	ret = setsockopt(sock, SOL_SOCKET, SO_LINGER, &linger_opt,
			 sizeof(linger_opt));
	if (ret < 0) {
		ret = -errno;
		pr_err("setsockopt(SO_LINGER): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}